

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O2

bool __thiscall TTTBoard::IsDraw(TTTBoard *this)

{
  bool bVar1;
  int i;
  long lVar2;
  long lVar3;
  
  bVar1 = true;
  for (lVar2 = 0; lVar3 = 1, lVar2 != 3; lVar2 = lVar2 + 1) {
    for (; lVar3 != 4; lVar3 = lVar3 + 1) {
      bVar1 = (bool)(bVar1 & *(int *)((long)(this->m_board + -1) + 8 + lVar3 * 4) != 2);
    }
    this = (TTTBoard *)(this->m_board[0] + 2);
  }
  return bVar1;
}

Assistant:

bool TTTBoard::IsDraw() const
{
    bool draw = true;

    // Check if every cell is a blank
    for(int i = 0; i < MAX_ROWS; ++i)
    {
        for(int j = 0; j < MAX_COLS; ++j)
        {
            if(m_board[i][j] == BLANK)
                draw = false;
        }
    }

    return draw;
}